

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O2

Info * re2::Prefilter::Info::Literal(Rune r)

{
  Info *this;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this = (Info *)operator_new(0x40);
  p_Var1 = &(this->exact_)._M_t._M_impl.super__Rb_tree_header;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_exact_ = false;
  this->match_ = (Prefilter *)0x0;
  ToLowerRune(r);
  RuneToString_abi_cxx11_(0);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  this->is_exact_ = true;
  return this;
}

Assistant:

Prefilter::Info* Prefilter::Info::Literal(Rune r) {
  Info* info = new Info();
  info->exact_.insert(RuneToString(ToLowerRune(r)));
  info->is_exact_ = true;
  return info;
}